

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

NodeIterator __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren
          (UArrIntermediateNode *this)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  long in_RSI;
  
  uVar1 = *(undefined4 *)(in_RSI + 0x14);
  pp_Var2 = (_func_int **)
            Lib::FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  *pp_Var2 = (_func_int *)&PTR__IteratorCore_00b28960;
  pp_Var2[4] = (_func_int *)(in_RSI + 0x18);
  pp_Var2[5] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 6) = uVar1;
  pp_Var2[7] = (_func_int *)0x0;
  (this->super_IntermediateNode).super_Node._vptr_Node = pp_Var2;
  *(undefined4 *)(pp_Var2 + 1) = 1;
  return (NodeIterator)
         (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)this;
}

Assistant:

NodeIterator variableChildren()
      {
        return pvi( arrayIter(_nodes, _size)
              .filter([](auto& n) { return n->term().isVar(); })
              .map([](Node *& n) { return &n; }));
      }